

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

grp_stack_data pop_grp_stack(grp_stack *mystack)

{
  long lVar1;
  char *pcVar2;
  long *in_RDI;
  grp_stack_item *newtop;
  grp_stack_data retval;
  
  pcVar2 = grp_stack_default;
  if ((in_RDI != (long *)0x0) && (in_RDI[1] != 0)) {
    lVar1 = *(long *)(in_RDI[1] + 0x10);
    pcVar2 = grp_stack_remove((grp_stack_item *)grp_stack_default);
    in_RDI[1] = lVar1;
    lVar1 = *in_RDI;
    *in_RDI = lVar1 + -1;
    if (lVar1 + -1 == 0) {
      in_RDI[1] = 0;
    }
  }
  return pcVar2;
}

Assistant:

static grp_stack_data pop_grp_stack(grp_stack* mystack) {
  grp_stack_data retval = grp_stack_default;
  if(mystack && mystack->top) {
    grp_stack_item* newtop = mystack->top->prev;
    retval = grp_stack_remove(mystack->top);
    mystack->top = newtop;
    if(0 == --mystack->stack_size) mystack->top = NULL;
  }
  return retval;
}